

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall Json::StyledWriter::writeCommentBeforeValue(StyledWriter *this,Value *root)

{
  bool bVar1;
  string local_58;
  string local_38;
  Value *local_18;
  Value *root_local;
  StyledWriter *this_local;
  
  local_18 = root;
  root_local = (Value *)this;
  bVar1 = Value::hasComment(root,commentBefore);
  if (bVar1) {
    Value::getComment_abi_cxx11_(&local_58,local_18,commentBefore);
    normalizeEOL(&local_38,&local_58);
    std::__cxx11::string::operator+=((string *)&this->document_,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::operator+=((string *)&this->document_,anon_var_dwarf_b6472 + 8);
  }
  return;
}

Assistant:

void 
StyledWriter::writeCommentBeforeValue( const Value &root )
{
   if ( !root.hasComment( commentBefore ) )
      return;
   document_ += normalizeEOL( root.getComment( commentBefore ) );
   document_ += "\n";
}